

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

char * GetOpName(SynBinaryOpType type)

{
  char *pcStack_10;
  SynBinaryOpType type_local;
  
  switch(type) {
  case SYN_BINARY_OP_ADD:
    pcStack_10 = "+";
    break;
  case SYN_BINARY_OP_SUB:
    pcStack_10 = "-";
    break;
  case SYN_BINARY_OP_MUL:
    pcStack_10 = "*";
    break;
  case SYN_BINARY_OP_DIV:
    pcStack_10 = "/";
    break;
  case SYN_BINARY_OP_MOD:
    pcStack_10 = "%";
    break;
  case SYN_BINARY_OP_POW:
    pcStack_10 = "**";
    break;
  case SYN_BINARY_OP_SHL:
    pcStack_10 = "<<";
    break;
  case SYN_BINARY_OP_SHR:
    pcStack_10 = ">>";
    break;
  case SYN_BINARY_OP_LESS:
    pcStack_10 = "<";
    break;
  case SYN_BINARY_OP_LESS_EQUAL:
    pcStack_10 = "<=";
    break;
  case SYN_BINARY_OP_GREATER:
    pcStack_10 = ">";
    break;
  case SYN_BINARY_OP_GREATER_EQUAL:
    pcStack_10 = ">=";
    break;
  case SYN_BINARY_OP_EQUAL:
    pcStack_10 = "==";
    break;
  case SYN_BINARY_OP_NOT_EQUAL:
    pcStack_10 = "!=";
    break;
  case SYN_BINARY_OP_BIT_AND:
    pcStack_10 = "&";
    break;
  case SYN_BINARY_OP_BIT_OR:
    pcStack_10 = "|";
    break;
  case SYN_BINARY_OP_BIT_XOR:
    pcStack_10 = "^";
    break;
  case SYN_BINARY_OP_LOGICAL_AND:
    pcStack_10 = "&&";
    break;
  case SYN_BINARY_OP_LOGICAL_OR:
    pcStack_10 = "||";
    break;
  case SYN_BINARY_OP_LOGICAL_XOR:
    pcStack_10 = "^^";
    break;
  case SYN_BINARY_OP_IN:
    pcStack_10 = "in";
    break;
  default:
    __assert_fail("!\"unknown operation type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0xece,"const char *GetOpName(SynBinaryOpType)");
  }
  return pcStack_10;
}

Assistant:

const char* GetOpName(SynBinaryOpType type)
{
	switch(type)
	{
	case SYN_BINARY_OP_ADD:
		return "+";
	case SYN_BINARY_OP_SUB:
		return "-";
	case SYN_BINARY_OP_MUL:
		return "*";
	case SYN_BINARY_OP_DIV:
		return "/";
	case SYN_BINARY_OP_MOD:
		return "%";
	case SYN_BINARY_OP_POW:
		return "**";
	case SYN_BINARY_OP_SHL:
		return "<<";
	case SYN_BINARY_OP_SHR:
		return ">>";
	case SYN_BINARY_OP_LESS:
		return "<";
	case SYN_BINARY_OP_LESS_EQUAL:
		return "<=";
	case SYN_BINARY_OP_GREATER:
		return ">";
	case SYN_BINARY_OP_GREATER_EQUAL:
		return ">=";
	case SYN_BINARY_OP_EQUAL:
		return "==";
	case SYN_BINARY_OP_NOT_EQUAL:
		return "!=";
	case SYN_BINARY_OP_BIT_AND:
		return "&";
	case SYN_BINARY_OP_BIT_OR:
		return "|";
	case SYN_BINARY_OP_BIT_XOR:
		return "^";
	case SYN_BINARY_OP_LOGICAL_AND:
		return "&&";
	case SYN_BINARY_OP_LOGICAL_OR:
		return "||";
	case SYN_BINARY_OP_LOGICAL_XOR:
		return "^^";
	case SYN_BINARY_OP_IN:
		return "in";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}